

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_CfdGetValueCommitment_Test::TestBody
          (cfdcapi_elements_transaction_CfdGetValueCommitment_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  char **in_stack_00000038;
  char *in_stack_00000040;
  char *in_stack_00000048;
  int64_t in_stack_00000050;
  void *in_stack_00000058;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  char *str_buffer;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *commitment;
  char *vbf;
  char *asset;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffde8;
  AssertionResult *in_stack_fffffffffffffdf0;
  CfdErrorCode *in_stack_fffffffffffffdf8;
  AssertionResult *pAVar4;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  void **in_stack_fffffffffffffe08;
  void *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe88;
  AssertHelper local_170;
  Message local_168;
  undefined4 local_15c;
  AssertionResult local_158;
  AssertHelper local_148;
  Message local_140;
  AssertionResult local_138;
  AssertHelper local_128;
  Message local_120;
  undefined4 local_114;
  AssertionResult local_110;
  char *local_100;
  AssertHelper local_f8;
  Message local_f0;
  AssertionResult local_e8;
  AssertHelper local_d8;
  Message local_d0;
  undefined4 local_c4;
  AssertionResult local_c0;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffffe08);
  local_2c = 0;
  pAVar4 = &local_28;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffe08,
             (char *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
             in_stack_fffffffffffffdf8,(int *)in_stack_fffffffffffffdf0);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!(bool)uVar1) {
    testing::Message::Message(local_48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3696ba);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x78a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x36971d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x369772);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(type *)0x3697a6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar2) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x78b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x3698a2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x36991d);
  if (local_14 == 0) {
    local_a0 = "0a533b742a568c0b5285bf5bdfe9623a78082d19fac9be1678f7c3adbb48b34d29";
    local_a8 = "fe3357df1f35df75412d9ad86ebd99e622e26019722f316027787a685e2cd71a";
    local_b0 = (char *)0x0;
    local_14 = CfdGetValueCommitment
                         (in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040,
                          in_stack_00000038);
    local_c4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffe08,
               (char *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
               in_stack_fffffffffffffdf8,(int *)in_stack_fffffffffffffdf0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
    if (!bVar2) {
      testing::Message::Message(&local_d0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x369a2c);
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x794,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_d8);
      testing::Message::~Message((Message *)0x369a89);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x369ade);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_e8,
                 "\"08672d4e2e60f2e8d742552a8bc4ca6335ed214982c7728b4483284169aaae7f49\"",
                 "commitment","08672d4e2e60f2e8d742552a8bc4ca6335ed214982c7728b4483284169aaae7f49",
                 local_b0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
      if (!bVar2) {
        testing::Message::Message(&local_f0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x369b81);
        testing::internal::AssertHelper::AssertHelper
                  (&local_f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x798,pcVar3);
        testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
        testing::internal::AssertHelper::~AssertHelper(&local_f8);
        testing::Message::~Message((Message *)0x369bde);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x369c33);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffdf8);
    }
  }
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffffe28);
  if (local_14 != 0) {
    local_100 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage
                         ((void *)CONCAT17(uVar1,in_stack_fffffffffffffe88),(char **)pAVar4);
    local_114 = 0;
    pAVar4 = &local_110;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffe08,
               (char *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
               in_stack_fffffffffffffdf8,(int *)in_stack_fffffffffffffdf0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
    if (!bVar2) {
      testing::Message::Message(&local_120);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x369d2f);
      testing::internal::AssertHelper::AssertHelper
                (&local_128,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x7a1,pcVar3);
      testing::internal::AssertHelper::operator=(&local_128,&local_120);
      testing::internal::AssertHelper::~AssertHelper(&local_128);
      testing::Message::~Message((Message *)0x369d8c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x369de1);
    testing::internal::CmpHelperSTREQ((internal *)&local_138,"\"\"","str_buffer","",local_100);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_138);
    if (!bVar2) {
      testing::Message::Message(&local_140);
      in_stack_fffffffffffffe08 =
           (void **)testing::AssertionResult::failure_message((AssertionResult *)0x369e76);
      testing::internal::AssertHelper::AssertHelper
                (&local_148,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x7a2,(char *)in_stack_fffffffffffffe08);
      testing::internal::AssertHelper::operator=(&local_148,&local_140);
      testing::internal::AssertHelper::~AssertHelper(&local_148);
      testing::Message::~Message((Message *)0x369ed3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x369f28);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffdf8);
    local_100 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffdf8);
  local_15c = 0;
  pAVar4 = &local_158;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffe08,
             (char *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
             (CfdErrorCode *)pAVar4,(int *)in_stack_fffffffffffffdf0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar2) {
    testing::Message::Message(&local_168);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x369ff8);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x7a8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    testing::Message::~Message((Message *)0x36a055);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x36a0aa);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, CfdGetValueCommitment) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  if (ret == kCfdSuccess) {
    const char* asset =
        "0a533b742a568c0b5285bf5bdfe9623a78082d19fac9be1678f7c3adbb48b34d29";
    const char* vbf = "fe3357df1f35df75412d9ad86ebd99e622e26019722f316027787a685e2cd71a";

    char* commitment = nullptr;
    ret = CfdGetValueCommitment(handle, int64_t{13000000000000}, asset, vbf, &commitment);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
          "08672d4e2e60f2e8d742552a8bc4ca6335ed214982c7728b4483284169aaae7f49",
          commitment);
      CfdFreeStringBuffer(commitment);
    }
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}